

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bisstemeqcaselessblk(bstring b0,void *blk,int len)

{
  byte bVar1;
  byte bVar2;
  uchar *puVar3;
  int iVar4;
  __int32_t **pp_Var5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  iVar4 = -1;
  if (((b0 != (bstring)0x0) && (puVar3 = b0->data, iVar4 = -1, puVar3 != (uchar *)0x0)) &&
     (-1 < (b0->slen | len) && blk != (void *)0x0)) {
    if (b0->slen < len) {
LAB_001113b1:
      iVar4 = 0;
    }
    else {
      iVar4 = 1;
      if (0 < len && puVar3 != (uchar *)blk) {
        uVar8 = 0;
        do {
          bVar1 = puVar3[uVar8];
          uVar7 = (uint)bVar1;
          bVar2 = *(byte *)((long)blk + uVar8);
          uVar6 = (uint)bVar2;
          if (bVar1 != bVar2) {
            if (-1 < (char)bVar1) {
              pp_Var5 = __ctype_tolower_loc();
              uVar7 = (*pp_Var5)[bVar1];
            }
            if (-1 < (char)bVar2) {
              pp_Var5 = __ctype_tolower_loc();
              uVar6 = (*pp_Var5)[bVar2];
            }
            if (uVar7 != uVar6) goto LAB_001113b1;
          }
          uVar8 = uVar8 + 1;
        } while ((uint)len != uVar8);
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

int bisstemeqcaselessblk (const bstring b0, const void * blk, int len) {
int i;

	if (bdata (b0) == NULL || b0->slen < 0 || NULL == blk || len < 0)
		return BSTR_ERR;
	if (b0->slen < len) return 0;
	if (b0->data == (const unsigned char *) blk || len == 0) return 1;

	for (i = 0; i < len; i ++) {
		if (b0->data[i] != ((const unsigned char *) blk)[i]) {
			if (downcase (b0->data[i]) != 
			    downcase (((const unsigned char *) blk)[i])) return 0;
		}
	}
	return 1;
}